

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvscsu.cpp
# Opt level: O3

void useDynamicWindow(SCSUData *scsu,int8_t window)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = (int)scsu->nextWindowUseIndex;
  iVar3 = iVar6;
  do {
    bVar1 = iVar3 < 1;
    iVar3 = iVar3 + -1;
    if (bVar1) {
      iVar3 = 7;
    }
    lVar4 = (long)iVar3;
  } while (scsu->windowUse[lVar4] != window);
  iVar5 = iVar3 + 1;
  if (iVar3 + 1 == 8) {
    iVar5 = 0;
  }
  while (iVar5 != iVar6) {
    lVar4 = (long)iVar5;
    scsu->windowUse[iVar3] = scsu->windowUse[lVar4];
    iVar2 = iVar5 + 1;
    if (iVar5 + 1 == 8) {
      iVar2 = 0;
    }
    iVar3 = iVar5;
    iVar5 = iVar2;
    iVar6 = (int)scsu->nextWindowUseIndex;
  }
  scsu->windowUse[lVar4] = window;
  return;
}

Assistant:

static void
useDynamicWindow(SCSUData *scsu, int8_t window) {
    /*
     * move the existing window, which just became the most recently used one,
     * up in windowUse[] to nextWindowUseIndex-1
     */

    /* first, find the index of the window - backwards to favor the more recently used windows */
    int i, j;

    i=scsu->nextWindowUseIndex;
    do {
        if(--i<0) {
            i=7;
        }
    } while(scsu->windowUse[i]!=window);

    /* now copy each windowUse[i+1] to [i] */
    j=i+1;
    if(j==8) {
        j=0;
    }
    while(j!=scsu->nextWindowUseIndex) {
        scsu->windowUse[i]=scsu->windowUse[j];
        i=j;
        if(++j==8) { j=0; }
    }

    /* finally, set the window into the most recently used index */
    scsu->windowUse[i]=window;
}